

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  Message *value;
  Reflection *this;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  *puVar1 = '\v';
  puVar1 = WireFormatLite::WriteUInt32ToArray(2,*(uint32_t *)(field + 4),puVar1 + 1);
  value = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  puVar1 = WireFormatLite::InternalWriteMessage<google::protobuf::Message>(3,value,puVar1,stream);
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar1);
  *puVar1 = '\f';
  return puVar1 + 1;
}

Assistant:

uint8_t* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessage(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}